

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>::SmallVector
          (SmallVector<llvm::DWARFDebugMacro::Entry,_4U> *this,
          SmallVector<llvm::DWARFDebugMacro::Entry,_4U> *RHS)

{
  bool bVar1;
  SmallVector<llvm::DWARFDebugMacro::Entry,_4U> *RHS_local;
  SmallVector<llvm::DWARFDebugMacro::Entry,_4U> *this_local;
  
  SmallVectorImpl<llvm::DWARFDebugMacro::Entry>::SmallVectorImpl
            (&this->super_SmallVectorImpl<llvm::DWARFDebugMacro::Entry>,4);
  bVar1 = SmallVectorBase::empty((SmallVectorBase *)RHS);
  if (!bVar1) {
    SmallVectorImpl<llvm::DWARFDebugMacro::Entry>::operator=
              (&this->super_SmallVectorImpl<llvm::DWARFDebugMacro::Entry>,
               &RHS->super_SmallVectorImpl<llvm::DWARFDebugMacro::Entry>);
  }
  return;
}

Assistant:

SmallVector(const SmallVector &RHS) : SmallVectorImpl<T>(N) {
    if (!RHS.empty())
      SmallVectorImpl<T>::operator=(RHS);
  }